

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall cs_impl::fiber::Routine::Routine(Routine *this,context_t *cxt,function<void_()> *f)

{
  size_t s;
  
  this->this_context = (process_context *)cs::current_process;
  cs::process_context::fork((process_context *)&this->cs_pcontext);
  s = 100;
  if (999 < *(ulong *)(cs::current_process + 0x78)) {
    s = *(ulong *)(cs::current_process + 0x78) / 10;
  }
  cs::stack_type<cs::domain_type,_std::allocator>::stack_type(&this->cs_stack,s);
  this->cs_context = cxt;
  std::function<void_()>::function(&this->func,f);
  this->stack = (char *)0x0;
  this->finished = false;
  return;
}

Assistant:

Routine(const cs::context_t &cxt, std::function<void()> f) : cs_pcontext(cs::current_process->fork()), cs_stack(cs::current_process->child_stack_size()), cs_context(cxt), func(std::move(f))
			{
				stack = nullptr;
				finished = false;
			}